

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

ptls_t * ptls_client_new(ptls_context_t *ctx)

{
  ptls_t *tls_00;
  ptls_iovec_t pVar1;
  ptls_t *tls;
  int in_stack_000001e4;
  ptls_context_t *in_stack_000001e8;
  uint8_t *local_20;
  size_t local_18;
  
  tls_00 = new_instance(in_stack_000001e8,in_stack_000001e4);
  tls_00->state = PTLS_STATE_CLIENT_HANDSHAKE_START;
  (*tls_00->ctx->random_bytes)(tls_00->client_random,0x20);
  log_client_random(tls_00);
  if (((byte)tls_00->field_0x160 >> 2 & 1) != 0) {
    pVar1 = ptls_iovec_init((void *)((long)&tls_00->field_18 + 0x10),0x20);
    local_20 = pVar1.base;
    (tls_00->field_18).client.legacy_session_id.base = local_20;
    local_18 = pVar1.len;
    (tls_00->field_18).client.legacy_session_id.len = local_18;
    (*tls_00->ctx->random_bytes)
              ((tls_00->field_18).client.legacy_session_id.base,
               (tls_00->field_18).client.legacy_session_id.len);
  }
  return tls_00;
}

Assistant:

ptls_t *ptls_client_new(ptls_context_t *ctx)
{
    ptls_t *tls = new_instance(ctx, 0);
    tls->state = PTLS_STATE_CLIENT_HANDSHAKE_START;
    tls->ctx->random_bytes(tls->client_random, sizeof(tls->client_random));
    log_client_random(tls);
    if (tls->send_change_cipher_spec) {
        tls->client.legacy_session_id =
            ptls_iovec_init(tls->client.legacy_session_id_buf, sizeof(tls->client.legacy_session_id_buf));
        tls->ctx->random_bytes(tls->client.legacy_session_id.base, tls->client.legacy_session_id.len);
    }

    PTLS_PROBE(NEW, tls, 0);
    return tls;
}